

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *this
          ,TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string *local_420;
  undefined1 *local_2e8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string shader_source;
  size_t string_index;
  allocator<char> local_248;
  allocator<char> local_247;
  allocator<char> local_246;
  allocator<char> local_245;
  allocator<char> local_244;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  string *local_240;
  string local_238 [8];
  string input [15];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string shader_variable_declarations;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  shader_variable_declarations.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "= float[2][1][2][1](\n        float[1][2][1](\n            float[2][1]( \n                float[1](12.3), float[1](54.2) \n            )\n        ),\n        float[1][2][1](\n            float[2][1]( \n                float[1]( 3.2), float[1]( 7.4) \n            )\n        )\n    );\n\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  string_index._0_1_ = 1;
  local_240 = local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"float a[2][1][2][]",&local_241);
  local_240 = (string *)(input[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0].field_2._M_local_buf + 8),"float a[2][1][][1]",&local_242);
  local_240 = (string *)(input[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[1].field_2._M_local_buf + 8),"float a[2][1][][]",&local_243);
  local_240 = (string *)(input[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[2].field_2._M_local_buf + 8),"float a[2][][2][1]",&local_244);
  local_240 = (string *)(input[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[3].field_2._M_local_buf + 8),"float a[2][][2][]",&local_245);
  local_240 = (string *)(input[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[4].field_2._M_local_buf + 8),"float a[2][][][1]",&local_246);
  local_240 = (string *)(input[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[5].field_2._M_local_buf + 8),"float a[2][][][]",&local_247);
  local_240 = (string *)(input[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[6].field_2._M_local_buf + 8),"float a[][1][2][1]",&local_248);
  local_240 = (string *)(input[7].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[7].field_2._M_local_buf + 8),"float a[][1][2][]",
             (allocator<char> *)((long)&string_index + 7));
  local_240 = (string *)(input[8].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[8].field_2._M_local_buf + 8),"float a[][1][][1]",
             (allocator<char> *)((long)&string_index + 6));
  local_240 = (string *)(input[9].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[9].field_2._M_local_buf + 8),"float a[][1][][]",
             (allocator<char> *)((long)&string_index + 5));
  local_240 = (string *)(input[10].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[10].field_2._M_local_buf + 8),"float a[][][2][1]",
             (allocator<char> *)((long)&string_index + 4));
  local_240 = (string *)(input[0xb].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0xb].field_2._M_local_buf + 8),"float a[][][2][]",
             (allocator<char> *)((long)&string_index + 3));
  local_240 = (string *)(input[0xc].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0xc].field_2._M_local_buf + 8),"float a[][][][1]",
             (allocator<char> *)((long)&string_index + 2));
  local_240 = (string *)(input[0xd].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0xd].field_2._M_local_buf + 8),"float a[][][][]",
             (allocator<char> *)((long)&string_index + 1));
  string_index._0_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 7));
  std::allocator<char>::~allocator(&local_248);
  std::allocator<char>::~allocator(&local_247);
  std::allocator<char>::~allocator(&local_246);
  std::allocator<char>::~allocator(&local_245);
  std::allocator<char>::~allocator(&local_244);
  std::allocator<char>::~allocator(&local_243);
  std::allocator<char>::~allocator(&local_242);
  std::allocator<char>::~allocator(&local_241);
  for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 0xf;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_,"    ");
    std::operator+(&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input[shader_source.field_2._8_8_ + -1].field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&cs);
    switch(shader_variable_declarations.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_278,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_278,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_278,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x847);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_278,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_2e8 = default_fragment_shader_source_abi_cxx11_;
    switch(shader_variable_declarations.field_2._12_4_) {
    case 0:
      local_2e8 = local_278;
      break;
    case 1:
      tcs = (string *)local_278;
      break;
    case 2:
      vs = (string *)local_278;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_2e8 = empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)local_278;
      break;
    case 4:
      tes = (string *)local_278;
      break;
    case 5:
      gs = (string *)local_278;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x84a);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_2e8,vs,1,0);
    std::__cxx11::string::~string((string *)local_278);
  }
  local_420 = (string *)(input[0xe].field_2._M_local_buf + 8);
  do {
    local_420 = local_420 + -0x20;
    std::__cxx11::string::~string(local_420);
  } while (local_420 != local_238);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_variable_declarations = "= float[2][1][2][1](\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1](12.3), float[1](54.2) \n"
											   "            )\n"
											   "        ),\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1]( 3.2), float[1]( 7.4) \n"
											   "            )\n"
											   "        )\n"
											   "    );\n\n";

	std::string input[] = { "float a[2][1][2][]", "float a[2][1][][1]", "float a[2][1][][]", "float a[2][][2][1]",
							"float a[2][][2][]",  "float a[2][][][1]",  "float a[2][][][]",  "float a[][1][2][1]",
							"float a[][1][2][]",  "float a[][1][][1]",  "float a[][1][][]",  "float a[][][2][1]",
							"float a[][][2][]",   "float a[][][][1]",   "float a[][][][]" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + "    " + input[string_index] + shader_variable_declarations;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}